

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O0

bool __thiscall libebml::EbmlMaster::ProcessMandatory(EbmlMaster *this)

{
  bool bVar1;
  size_t sVar2;
  EbmlElement *element;
  uint local_1c;
  uint EltIdx;
  EbmlMaster *this_local;
  
  if (this->Context->Size != 0) {
    sVar2 = EbmlSemanticContext::GetSize(this->Context);
    if (sVar2 == 0) {
      __assert_fail("Context.GetSize() != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                    ,0xbb,"bool libebml::EbmlMaster::ProcessMandatory()");
    }
    for (local_1c = 0; (ulong)local_1c < this->Context->Size; local_1c = local_1c + 1) {
      bVar1 = EbmlSemantic::IsMandatory(this->Context->MyTable + local_1c);
      if ((bVar1) && (bVar1 = EbmlSemantic::IsUnique(this->Context->MyTable + local_1c), bVar1)) {
        element = EbmlSemantic::Create(this->Context->MyTable + local_1c);
        PushElement(this,element);
      }
    }
  }
  return true;
}

Assistant:

bool EbmlMaster::ProcessMandatory()
{
  if (EBML_CTX_SIZE(Context) == 0)
  {
    return true;
  }

  assert(Context.GetSize() != 0);

  unsigned int EltIdx;
  for (EltIdx = 0; EltIdx < EBML_CTX_SIZE(Context); EltIdx++) {
    if (EBML_CTX_IDX(Context,EltIdx).IsMandatory() && EBML_CTX_IDX(Context,EltIdx).IsUnique()) {
//      assert(EBML_CTX_IDX(Context,EltIdx).Create != NULL);
            PushElement(EBML_SEM_CREATE(EBML_CTX_IDX(Context,EltIdx)));
    }
  }
  return true;
}